

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndsWithMatch.cpp
# Opt level: O0

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::EndsWithMatch::match(EndsWithMatch *this,shared_ptr<const_oout::Text> *in)

{
  element_type *peVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  __shared_ptr_access<const_oout::Text,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  string local_230 [39];
  allocator local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e1 [17];
  undefined1 local_1d0 [32];
  ostringstream message;
  string local_40 [8];
  string origin;
  shared_ptr<const_oout::Text> *in_local;
  EndsWithMatch *this_local;
  
  peVar1 = std::__shared_ptr_access<const_oout::Text,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  (*peVar1->_vptr_Text[2])(local_40);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 0x18));
  poVar2 = std::operator<<((ostream *)(local_1d0 + 0x18),"\'");
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2,"\' ends with \'");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(in->
                                   super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>)
                                   ._M_refcount);
  std::operator<<(poVar2,"\'");
  lVar3 = std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,local_40,lVar3 - lVar4,&local_209);
  local_1e1[0] = (_Alloc_hider)
                 std::operator==(&local_208,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&(in->
                                     super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount);
  std::__cxx11::ostringstream::str();
  std::make_shared<oout::CondResult,bool,std::__cxx11::string>
            ((bool *)(local_1e1 + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e1);
  std::make_unique<oout::TestResult,std::shared_ptr<oout::CondResult>>
            ((shared_ptr<oout::CondResult> *)local_1d0);
  std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>::
  unique_ptr<oout::TestResult,std::default_delete<oout::TestResult>,void>
            ((unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>> *)this,
             (unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1d0);
  std::unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_>::~unique_ptr
            ((unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1d0);
  std::shared_ptr<oout::CondResult>::~shared_ptr((shared_ptr<oout::CondResult> *)(local_1e1 + 1));
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d0 + 0x18));
  std::__cxx11::string::~string(local_40);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> EndsWithMatch::match(const shared_ptr<const Text> &in) const
{
	const auto origin = in->asString();
	ostringstream message;
	message << "'" << origin << "' ends with '" << text << "'";

	return make_unique<TestResult>(
		make_shared<CondResult>(
			string(origin, origin.size() - text.size()) == text,
			message.str()
		)
	);
}